

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_isEquivalentBaseUnitNotInModel_Test::~Units_isEquivalentBaseUnitNotInModel_Test
          (Units_isEquivalentBaseUnitNotInModel_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, isEquivalentBaseUnitNotInModel)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName("model");

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("u");
    u->addUnit("apples", 0, 1.0, 1.0);

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit(libcellml::Units::StandardUnit::RADIAN, 0, 1.0, 1.0);

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::RADIAN, 0, 1.0, 1.0);
    u2->addUnit("u", 0, 1.0, 1.0);
    // u1 compatible to u2 test should fail because base unit "u" is not present in u1, regardless of whether "apples" exists or not

    model->addUnits(u1);
    model->addUnits(u2);

    // Units "u" not in model.  Units "apples" doesn't exist.  Units are not linked.
    EXPECT_FALSE(libcellml::Units::compatible(u1, u2));
    EXPECT_FALSE(libcellml::Units::compatible(u2, u1));
}